

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.h
# Opt level: O2

void __thiscall
embree::CommandLineParser::
CommandLineOptionClosure<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/tutorials/verify/verify.cpp:6847:27)>
::parse(CommandLineOptionClosure<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_verify_verify_cpp:6847:27)>
        *this,Ref<embree::ParseStream> *cin,FileName *path)

{
  ParseStream *this_00;
  VerifyApplication *this_01;
  Test *pTVar1;
  size_t sVar2;
  ostream *poVar3;
  Ref<embree::VerifyApplication::Test> local_68;
  Ref<embree::VerifyApplication::Test> local_60;
  string regex;
  string local_38;
  
  this_00 = cin->ptr;
  if (this_00 != (ParseStream *)0x0) {
    (*(this_00->
      super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ).super_RefCount._vptr_RefCount[2])(this_00);
  }
  this_01 = (this->f).this;
  if (this_01->user_specified_tests == false) {
    pTVar1 = (this_01->tests).ptr;
    local_60.ptr = pTVar1;
    if (pTVar1 != (Test *)0x0) {
      (*(pTVar1->super_RefCount)._vptr_RefCount[2])(pTVar1);
    }
    VerifyApplication::enable_disable_all_tests(this_01,&local_60,false);
    if (pTVar1 != (Test *)0x0) {
      (*(pTVar1->super_RefCount)._vptr_RefCount[3])(pTVar1);
    }
  }
  this_01->user_specified_tests = true;
  Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::get
            (&regex,&this_00->
                     super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            );
  pTVar1 = (this_01->tests).ptr;
  local_68.ptr = pTVar1;
  if (pTVar1 != (Test *)0x0) {
    (*(pTVar1->super_RefCount)._vptr_RefCount[2])(pTVar1);
  }
  std::__cxx11::string::string((string *)&local_38,(string *)&regex);
  sVar2 = VerifyApplication::enable_disable_some_tests(this_01,&local_68,&local_38,true);
  std::__cxx11::string::~string((string *)&local_38);
  if (pTVar1 != (Test *)0x0) {
    (*(pTVar1->super_RefCount)._vptr_RefCount[3])(pTVar1);
  }
  if (sVar2 != 0) {
    std::__cxx11::string::~string((string *)&regex);
    (*(this_00->
      super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ).super_RefCount._vptr_RefCount[3])(this_00);
    return;
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"no tests matched regular expression ");
  poVar3 = std::operator<<(poVar3,(string *)&regex);
  std::endl<char,std::char_traits<char>>(poVar3);
  exit(1);
}

Assistant:

virtual void parse(Ref<ParseStream> cin, const FileName& path) {
        f(cin,path);
      }